

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QTest.hpp
# Opt level: O3

int __thiscall Qentem::QTest::EndTests(QTest *this)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  wostream *pwVar5;
  
  iVar4 = 1;
  if (this->error_ == false) {
    iVar4 = 0;
    pcVar1 = TestOutPut::GetColor(TITLE);
    pcVar2 = TestOutPut::GetColor(PASS);
    pcVar3 = TestOutPut::GetColor(END);
    if (TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ == 0) {
      pwVar5 = (wostream *)&std::wcout;
    }
    else {
      pwVar5 = (wostream *)(TestOutPut::GetStreamCache[abi:cxx11]()::wss_abi_cxx11_ + 0x10);
    }
    pwVar5 = std::operator<<(pwVar5,pcVar1);
    pwVar5 = std::operator<<(pwVar5,this->test_name_);
    pwVar5 = std::operator<<(pwVar5,pcVar2);
    pwVar5 = std::operator<<(pwVar5," Passed all tests");
    pwVar5 = std::operator<<(pwVar5,pcVar3);
    std::operator<<(pwVar5,"\n\n");
  }
  return iVar4;
}

Assistant:

QENTEM_NOINLINE int EndTests() {
        if (!error_) {
            TestOutPut::Print(TestOutPut::GetColor(TestOutPut::Colors::TITLE), test_name_,
                              TestOutPut::GetColor(TestOutPut::Colors::PASS), " Passed all tests",
                              TestOutPut::GetColor(TestOutPut::Colors::END), "\n\n");
            return 0;
        }

        return 1;
    }